

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsObjectiveFunction::setupCliquePartition(HighsDomain_const&,HighsCliqueTable&)::__0,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  int iVar1;
  pointer piVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint *puVar8;
  uint uVar9;
  uint *puVar10;
  ulong uVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint *puVar17;
  ulong uVar18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var19;
  T tmp;
  uint *puVar20;
  int __tmp_13;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  _DistanceType __len;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsObjectiveFunction_cpp:106:13)>
  __cmp;
  long local_98;
  int local_74;
  
  uVar6 = (long)end._M_current - (long)begin._M_current >> 2;
  if ((long)uVar6 < 0x18) {
    if (!leftmost) {
LAB_002cf800:
      if (begin._M_current == end._M_current) {
        return;
      }
      if ((uint *)begin._M_current + 1 == (uint *)end._M_current) {
        return;
      }
      piVar2 = ((comp.this)->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar8 = (uint *)begin._M_current + 1;
      do {
        puVar10 = puVar8;
        uVar21 = ((uint *)begin._M_current)[1];
        uVar6 = (ulong)uVar21;
        uVar5 = *begin._M_current;
        lVar14 = (long)(int)uVar5;
        puVar8 = puVar10;
        if ((uint)piVar2[(int)uVar21] < (uint)piVar2[lVar14]) {
          uVar6 = uVar6 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                  uVar6 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20;
LAB_002cf8be:
          while( true ) {
            *puVar8 = (uint)lVar14;
            uVar5 = puVar8[-2];
            lVar14 = (long)(int)uVar5;
            if (((uint)piVar2[lVar14] <= (uint)piVar2[(int)uVar21]) &&
               (((uint)piVar2[lVar14] < (uint)piVar2[(int)uVar21] ||
                (((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <= uVar6))))
            break;
            puVar8 = puVar8 + -1;
          }
          puVar8[-1] = uVar21;
        }
        else if (((uint)piVar2[(int)uVar21] <= (uint)piVar2[lVar14]) &&
                (uVar6 = uVar6 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                         uVar6 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20,
                uVar6 < ((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                        (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20)))
        goto LAB_002cf8be;
        puVar8 = puVar10 + 1;
        begin._M_current = (int *)puVar10;
        if (puVar10 + 1 == (uint *)end._M_current) {
          return;
        }
      } while( true );
    }
  }
  else {
    puVar8 = (uint *)(end._M_current + -1);
    lVar14 = (long)end._M_current - (long)begin._M_current;
    local_74 = bad_allowed;
    do {
      uVar4 = uVar6 >> 1;
      piVar2 = ((comp.this)->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar6 < 0x81) {
        uVar21 = *begin._M_current;
        uVar5 = begin._M_current[uVar4];
        uVar11 = (ulong)uVar5;
        uVar9 = piVar2[(int)uVar21];
        if ((uVar9 < (uint)piVar2[(int)uVar5]) ||
           ((uVar9 <= (uint)piVar2[(int)uVar5] &&
            (((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             (uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar4] = uVar21;
          *begin._M_current = uVar5;
          uVar9 = piVar2[(int)uVar5];
        }
        else {
          uVar11 = (ulong)uVar21;
        }
        uVar21 = *puVar8;
        uVar5 = (uint)uVar11;
        if (((uint)piVar2[(int)uVar21] < uVar9) ||
           (((uint)piVar2[(int)uVar21] <= uVar9 &&
            (((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             (uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          *begin._M_current = uVar21;
          *puVar8 = uVar5;
          uVar5 = *begin._M_current;
        }
        uVar21 = begin._M_current[uVar4];
        uVar11 = (ulong)(int)uVar21;
        if (((uint)piVar2[(int)uVar5] < (uint)piVar2[uVar11]) ||
           (((uint)piVar2[(int)uVar5] <= (uint)piVar2[uVar11] &&
            (((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar4] = uVar5;
          *begin._M_current = uVar21;
        }
        else {
          uVar11 = (ulong)uVar5;
        }
      }
      else {
        uVar21 = begin._M_current[uVar4];
        uVar5 = *begin._M_current;
        uVar11 = (ulong)uVar5;
        uVar9 = piVar2[(int)uVar21];
        if ((uVar9 < (uint)piVar2[(int)uVar5]) ||
           ((uVar9 <= (uint)piVar2[(int)uVar5] &&
            (((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             (uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          *begin._M_current = uVar21;
          begin._M_current[uVar4] = uVar5;
          uVar9 = piVar2[(int)uVar5];
        }
        else {
          uVar11 = (ulong)uVar21;
        }
        uVar21 = *puVar8;
        uVar5 = (uint)uVar11;
        if (((uint)piVar2[(int)uVar21] < uVar9) ||
           (((uint)piVar2[(int)uVar21] <= uVar9 &&
            (((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             (uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar4] = uVar21;
          *puVar8 = uVar5;
          uVar5 = begin._M_current[uVar4];
        }
        uVar21 = *begin._M_current;
        if (((uint)piVar2[(int)uVar5] < (uint)piVar2[(int)uVar21]) ||
           (((uint)piVar2[(int)uVar5] <= (uint)piVar2[(int)uVar21] &&
            (((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          *begin._M_current = uVar5;
          begin._M_current[uVar4] = uVar21;
        }
        uVar21 = begin._M_current[uVar4 - 1];
        uVar5 = begin._M_current[1];
        uVar11 = (ulong)uVar5;
        uVar9 = piVar2[(int)uVar21];
        if ((uVar9 < (uint)piVar2[(int)uVar5]) ||
           ((uVar9 <= (uint)piVar2[(int)uVar5] &&
            (((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             (uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[1] = uVar21;
          begin._M_current[uVar4 - 1] = uVar5;
          uVar9 = piVar2[(int)uVar5];
        }
        else {
          uVar11 = (ulong)uVar21;
        }
        uVar21 = end._M_current[-2];
        uVar5 = (uint)uVar11;
        if (((uint)piVar2[(int)uVar21] < uVar9) ||
           (((uint)piVar2[(int)uVar21] <= uVar9 &&
            (((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             (uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar4 - 1] = uVar21;
          end._M_current[-2] = uVar5;
          uVar5 = begin._M_current[uVar4 - 1];
        }
        uVar21 = begin._M_current[1];
        if (((uint)piVar2[(int)uVar5] < (uint)piVar2[(int)uVar21]) ||
           (((uint)piVar2[(int)uVar5] <= (uint)piVar2[(int)uVar21] &&
            (((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[1] = uVar5;
          begin._M_current[uVar4 - 1] = uVar21;
        }
        uVar21 = begin._M_current[uVar4 + 1];
        uVar5 = begin._M_current[2];
        uVar11 = (ulong)uVar5;
        uVar9 = piVar2[(int)uVar21];
        if ((uVar9 < (uint)piVar2[(int)uVar5]) ||
           ((uVar9 <= (uint)piVar2[(int)uVar5] &&
            (((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             (uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[2] = uVar21;
          begin._M_current[uVar4 + 1] = uVar5;
          uVar9 = piVar2[(int)uVar5];
        }
        else {
          uVar11 = (ulong)uVar21;
        }
        uVar21 = end._M_current[-3];
        uVar5 = (uint)uVar11;
        if (((uint)piVar2[(int)uVar21] < uVar9) ||
           (((uint)piVar2[(int)uVar21] <= uVar9 &&
            (((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             (uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar4 + 1] = uVar21;
          end._M_current[-3] = uVar5;
          uVar5 = begin._M_current[uVar4 + 1];
        }
        uVar21 = begin._M_current[2];
        if (((uint)piVar2[(int)uVar5] < (uint)piVar2[(int)uVar21]) ||
           (((uint)piVar2[(int)uVar5] <= (uint)piVar2[(int)uVar21] &&
            (((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[2] = uVar5;
          begin._M_current[uVar4 + 1] = uVar21;
          uVar5 = uVar21;
        }
        uVar21 = begin._M_current[uVar4];
        uVar9 = begin._M_current[uVar4 - 1];
        uVar11 = (ulong)uVar9;
        uVar13 = piVar2[(int)uVar21];
        if ((uVar13 < (uint)piVar2[(int)uVar9]) ||
           ((uVar13 <= (uint)piVar2[(int)uVar9] &&
            (((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             (uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar4 - 1] = uVar21;
          begin._M_current[uVar4] = uVar9;
          uVar13 = piVar2[(int)uVar9];
          uVar9 = uVar21;
        }
        else {
          uVar11 = (ulong)uVar21;
        }
        lVar7 = (long)(int)uVar5;
        if (((uint)piVar2[lVar7] < uVar13) ||
           (((uint)piVar2[lVar7] <= uVar13 &&
            (((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             (uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar4] = uVar5;
          begin._M_current[uVar4 + 1] = (int)uVar11;
          uVar11 = (ulong)uVar5;
        }
        else {
          lVar7 = (long)(int)uVar11;
        }
        uVar21 = (uint)uVar11;
        if (((uint)piVar2[lVar7] < (uint)piVar2[(int)uVar9]) ||
           (((uint)piVar2[lVar7] <= (uint)piVar2[(int)uVar9] &&
            ((uVar11 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             uVar11 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
             ((ulong)uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
          begin._M_current[uVar4 - 1] = uVar21;
          begin._M_current[uVar4] = uVar9;
          uVar21 = uVar9;
        }
        iVar1 = *begin._M_current;
        *begin._M_current = uVar21;
        begin._M_current[uVar4] = iVar1;
        uVar11 = (ulong)(uint)*begin._M_current;
      }
      uVar21 = (uint)uVar11;
      uVar4 = uVar11 & 0xffffffff;
      if ((leftmost & 1U) == 0) {
        uVar9 = begin._M_current[-1];
        uVar5 = piVar2[(int)uVar21];
        if (((uint)piVar2[(int)uVar9] < uVar5) ||
           ((uVar22 = uVar4 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                      uVar4 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20,
            (uint)piVar2[(int)uVar9] <= uVar5 &&
            (((ulong)uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
             (ulong)uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) < uVar22))))
        goto LAB_002ceec5;
        lVar14 = 0;
        while( true ) {
          uVar9 = *(uint *)((long)puVar8 + lVar14);
          lVar7 = (long)(int)uVar9;
          if (((uint)piVar2[lVar7] <= uVar5) &&
             (((uint)piVar2[lVar7] < uVar5 ||
              (((ulong)uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
               (ulong)uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <= uVar22)))) break;
          lVar14 = lVar14 + -4;
        }
        puVar10 = (uint *)((long)puVar8 + lVar14);
        _Var19._M_current = begin._M_current;
        if (lVar14 == 0) {
          while (_Var19._M_current < puVar10) {
            _Var19._M_current = _Var19._M_current + 1;
            uVar13 = *_Var19._M_current;
            uVar11 = (ulong)(int)uVar13;
            if ((uVar5 < (uint)piVar2[uVar11]) ||
               (uVar5 <= (uint)piVar2[uVar11] &&
                uVar22 < ((ulong)uVar13 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                         (ulong)uVar13 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))) break;
          }
        }
        else {
          puVar20 = (uint *)(begin._M_current + 1);
          do {
            _Var19._M_current = (int *)puVar20;
            uVar13 = *_Var19._M_current;
            uVar11 = (ulong)(int)uVar13;
            if (uVar5 < (uint)piVar2[uVar11]) break;
            puVar20 = (uint *)_Var19._M_current + 1;
          } while (((uint)piVar2[uVar11] < uVar5) ||
                  (((ulong)uVar13 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                   (ulong)uVar13 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <= uVar22));
        }
        if (_Var19._M_current < puVar10) {
          do {
            *_Var19._M_current = (uint)lVar7;
            *puVar10 = (uint)uVar11;
            uVar5 = piVar2[(int)uVar21];
            do {
              do {
                puVar10 = puVar10 + -1;
                uVar9 = *puVar10;
                lVar7 = (long)(int)uVar9;
              } while (uVar5 < (uint)piVar2[lVar7]);
            } while ((uVar5 <= (uint)piVar2[lVar7]) &&
                    (uVar22 < ((ulong)uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                              (ulong)uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20)));
            puVar20 = (uint *)_Var19._M_current + 1;
            do {
              _Var19._M_current = (int *)puVar20;
              uVar13 = *_Var19._M_current;
              uVar11 = (ulong)(int)uVar13;
              if (uVar5 < (uint)piVar2[uVar11]) break;
              puVar20 = (uint *)_Var19._M_current + 1;
            } while (((uint)piVar2[uVar11] < uVar5) ||
                    (((ulong)uVar13 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                     (ulong)uVar13 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <= uVar22));
          } while (_Var19._M_current < puVar10);
        }
        *begin._M_current = uVar9;
        *puVar10 = uVar21;
        begin._M_current = (int *)(puVar10 + 1);
        lVar7 = (long)end._M_current - (long)begin._M_current;
        uVar6 = lVar7 >> 2;
      }
      else {
        uVar5 = piVar2[(int)uVar21];
LAB_002ceec5:
        local_98 = (long)(int)uVar21;
        uVar11 = uVar4 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 uVar4 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20;
        uVar4 = 4;
        while( true ) {
          uVar9 = *(uint *)((long)begin._M_current + uVar4);
          lVar7 = (long)(int)uVar9;
          if ((uVar5 <= (uint)piVar2[lVar7]) &&
             ((uVar5 < (uint)piVar2[lVar7] ||
              (uVar11 <= ((ulong)uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                         (ulong)uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) break;
          uVar4 = uVar4 + 4;
        }
        puVar10 = (uint *)(uVar4 + (long)begin._M_current);
        puVar20 = puVar8;
        if (uVar4 == 4) {
          while (puVar17 = puVar20 + 1, puVar10 < puVar20 + 1) {
            uVar9 = *puVar20;
            puVar17 = puVar20;
            if (((uint)piVar2[(int)uVar9] < uVar5) ||
               ((puVar20 = puVar20 + -1, (uint)piVar2[(int)uVar9] <= uVar5 &&
                (((ulong)uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 (ulong)uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) < uVar11))))
            break;
          }
        }
        else {
          do {
            puVar17 = puVar20;
            uVar9 = *puVar17;
            if ((uint)piVar2[(int)uVar9] < uVar5) break;
            puVar20 = puVar17 + -1;
          } while ((uVar5 < (uint)piVar2[(int)uVar9]) ||
                  (uVar11 <= ((ulong)uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                             (ulong)uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20)));
        }
        if (puVar10 < puVar17) {
          uVar18 = (ulong)*puVar17;
          puVar20 = puVar17;
          do {
            uVar22 = uVar4;
            *(int *)((long)begin._M_current + uVar22) = (int)uVar18;
            *puVar20 = (uint)lVar7;
            uVar5 = piVar2[local_98];
            while( true ) {
              uVar9 = *(uint *)((long)begin._M_current + uVar22 + 4);
              lVar7 = (long)(int)uVar9;
              if ((uVar5 <= (uint)piVar2[lVar7]) &&
                 ((uVar5 < (uint)piVar2[lVar7] ||
                  (uVar11 <= ((ulong)uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                             (ulong)uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20)))))
              break;
              uVar22 = uVar22 + 4;
            }
            puVar3 = puVar20 + -1;
            do {
              puVar20 = puVar3;
              uVar9 = *puVar20;
              uVar18 = (ulong)(int)uVar9;
              if ((uint)piVar2[uVar18] < uVar5) break;
              puVar3 = puVar20 + -1;
            } while ((uVar5 < (uint)piVar2[uVar18]) ||
                    (uVar11 <= ((ulong)uVar9 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                               (ulong)uVar9 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20)));
            uVar4 = uVar22 + 4;
          } while ((uint *)((long)begin._M_current + uVar22 + 4) < puVar20);
        }
        else {
          uVar22 = uVar4 - 4;
        }
        _Var19._M_current = begin._M_current + uVar22;
        puVar20 = (uint *)((long)begin._M_current + uVar22 + 4);
        *begin._M_current = puVar20[-1];
        puVar20[-1] = uVar21;
        uVar4 = (long)_Var19._M_current - (long)begin._M_current >> 2;
        lVar7 = (long)end._M_current - (long)puVar20;
        uVar11 = lVar7 >> 2;
        if (((long)uVar4 < (long)(uVar6 >> 3)) || ((long)uVar11 < (long)(uVar6 >> 3))) {
          local_74 = local_74 + -1;
          if (local_74 == 0) {
            uVar4 = uVar6 - 2 >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsObjectiveFunction::setupCliquePartition(HighsDomain_const&,HighsCliqueTable&)::__0>>
                        (begin,uVar4,uVar6,begin._M_current[uVar4],
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsObjectiveFunction_cpp:106:13)>
                          )comp.this);
              bVar23 = uVar4 != 0;
              uVar4 = uVar4 - 1;
            } while (bVar23);
            if (lVar14 < 5) {
              return;
            }
            lVar14 = (long)end._M_current - (long)begin._M_current;
            do {
              end._M_current = end._M_current + -1;
              iVar1 = *end._M_current;
              *end._M_current = *begin._M_current;
              lVar14 = lVar14 + -4;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsObjectiveFunction::setupCliquePartition(HighsDomain_const&,HighsCliqueTable&)::__0>>
                        (begin,0,lVar14 >> 2,iVar1,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsObjectiveFunction_cpp:106:13)>
                          )comp.this);
            } while (4 < lVar14);
            return;
          }
          if (0x17 < (long)uVar4) {
            uVar6 = uVar4 & 0xfffffffffffffffc;
            iVar1 = *begin._M_current;
            *begin._M_current = *(begin._M_current + uVar6);
            *(begin._M_current + uVar6) = iVar1;
            iVar1 = _Var19._M_current[-1];
            _Var19._M_current[-1] = *(_Var19._M_current - uVar6);
            *(_Var19._M_current - uVar6) = iVar1;
            if (0x80 < uVar4) {
              uVar4 = uVar4 >> 2;
              iVar1 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar4 + 1];
              begin._M_current[uVar4 + 1] = iVar1;
              iVar1 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar4 + 2];
              begin._M_current[uVar4 + 2] = iVar1;
              iVar1 = _Var19._M_current[-2];
              _Var19._M_current[-2] = _Var19._M_current[~uVar4];
              _Var19._M_current[~uVar4] = iVar1;
              iVar1 = _Var19._M_current[-3];
              _Var19._M_current[-3] = _Var19._M_current[-2 - uVar4];
              _Var19._M_current[-2 - uVar4] = iVar1;
            }
          }
          if (0x17 < (long)uVar11) {
            uVar6 = uVar11 & 0xfffffffffffffffc;
            iVar1 = _Var19._M_current[1];
            _Var19._M_current[1] = *(_Var19._M_current + uVar6 + 4);
            *(_Var19._M_current + uVar6 + 4) = iVar1;
            iVar1 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar6);
            *(end._M_current - uVar6) = iVar1;
            if (0x80 < uVar11) {
              uVar6 = uVar11 >> 2;
              iVar1 = _Var19._M_current[2];
              _Var19._M_current[2] = _Var19._M_current[uVar6 + 2];
              _Var19._M_current[uVar6 + 2] = iVar1;
              iVar1 = _Var19._M_current[3];
              _Var19._M_current[3] = _Var19._M_current[uVar6 + 3];
              _Var19._M_current[uVar6 + 3] = iVar1;
              iVar1 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar6];
              end._M_current[~uVar6] = iVar1;
              iVar1 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar6];
              end._M_current[-2 - uVar6] = iVar1;
            }
          }
        }
        else if (puVar17 <= puVar10) {
          if ((uVar22 & 0xfffffffffffffffb) != 0) {
            lVar14 = 0;
            uVar6 = 0;
            puVar10 = (uint *)(begin._M_current + 1);
            _Var12._M_current = begin._M_current;
            do {
              puVar17 = puVar10;
              uVar21 = ((uint *)_Var12._M_current)[1];
              uVar4 = (ulong)uVar21;
              uVar5 = *_Var12._M_current;
              if (((uint)piVar2[(int)uVar21] < (uint)piVar2[(int)uVar5]) ||
                 (((uint)piVar2[(int)uVar21] <= (uint)piVar2[(int)uVar5] &&
                  ((uVar4 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                   uVar4 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
                   ((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                   (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
                ((uint *)_Var12._M_current)[1] = uVar5;
                _Var12._M_current = begin._M_current;
                if (puVar17 + -1 != (uint *)begin._M_current) {
                  lVar15 = lVar14;
                  do {
                    uVar5 = *(uint *)((long)begin._M_current + lVar15 + -4);
                    if (((uint)piVar2[(int)uVar5] <= (uint)piVar2[(int)uVar21]) &&
                       (((uint)piVar2[(int)uVar5] < (uint)piVar2[(int)uVar21] ||
                        (((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                         (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <=
                         (uVar4 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                         uVar4 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
                      _Var12._M_current = (int *)(lVar15 + (long)begin._M_current);
                      break;
                    }
                    *(uint *)((long)begin._M_current + lVar15) = uVar5;
                    lVar15 = lVar15 + -4;
                  } while (lVar15 != 0);
                }
                *_Var12._M_current = uVar21;
                uVar6 = uVar6 + ((long)puVar17 - (long)_Var12._M_current >> 2);
                if (8 < uVar6) goto LAB_002cf67f;
              }
              lVar14 = lVar14 + 4;
              puVar10 = puVar17 + 1;
              _Var12._M_current = (int *)puVar17;
            } while (puVar17 + 1 != (uint *)_Var19._M_current);
          }
          if (puVar20 == (uint *)end._M_current) {
            return;
          }
          if (_Var19._M_current + 2 == end._M_current) {
            return;
          }
          lVar14 = 8;
          lVar15 = 0;
          uVar6 = 0;
          puVar10 = puVar20;
          do {
            uVar21 = *puVar10;
            puVar10 = (uint *)((long)_Var19._M_current + lVar14);
            uVar5 = *(uint *)((long)_Var19._M_current + lVar14);
            uVar4 = (ulong)uVar5;
            if (((uint)piVar2[(int)uVar5] < (uint)piVar2[(int)uVar21]) ||
               (((uint)piVar2[(int)uVar5] <= (uint)piVar2[(int)uVar21] &&
                ((uVar4 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 uVar4 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
                 ((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
              *puVar10 = uVar21;
              puVar17 = puVar20;
              if (lVar14 != 8) {
                lVar16 = lVar15;
                do {
                  uVar21 = *(uint *)((long)puVar20 + lVar16 + -4);
                  if (((uint)piVar2[(int)uVar21] <= (uint)piVar2[(int)uVar5]) &&
                     (((uint)piVar2[(int)uVar21] < (uint)piVar2[(int)uVar5] ||
                      (((ulong)uVar21 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                       (ulong)uVar21 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <=
                       (uVar4 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                       uVar4 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
                    puVar17 = (uint *)(lVar16 + (long)puVar20);
                    break;
                  }
                  *(uint *)((long)puVar20 + lVar16) = uVar21;
                  lVar16 = lVar16 + -4;
                } while (lVar16 != 0);
              }
              *puVar17 = uVar5;
              uVar6 = uVar6 + ((long)puVar10 - (long)puVar17 >> 2);
              if (8 < uVar6) break;
            }
            lVar16 = lVar14 + 4;
            lVar14 = lVar14 + 4;
            lVar15 = lVar15 + 4;
            if (_Var19._M_current + lVar16 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_002cf67f:
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsObjectiveFunction::setupCliquePartition(HighsDomain_const&,HighsCliqueTable&)::__0,false>
                  (begin,_Var19,comp,local_74,(bool)(leftmost & 1));
        leftmost = false;
        uVar6 = uVar11;
        begin._M_current = (int *)puVar20;
      }
      lVar14 = lVar7;
    } while (0x17 < (long)uVar6);
    if ((leftmost & 1U) == 0) goto LAB_002cf800;
  }
  if ((begin._M_current != end._M_current) &&
     ((uint *)begin._M_current + 1 != (uint *)end._M_current)) {
    piVar2 = ((comp.this)->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar14 = 0;
    puVar8 = (uint *)begin._M_current;
    puVar10 = (uint *)begin._M_current + 1;
    do {
      uVar21 = puVar8[1];
      uVar6 = (ulong)uVar21;
      uVar5 = *puVar8;
      if (((uint)piVar2[(int)uVar21] < (uint)piVar2[(int)uVar5]) ||
         (((uint)piVar2[(int)uVar21] <= (uint)piVar2[(int)uVar5] &&
          ((uVar6 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
           uVar6 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <
           ((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
           (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
        puVar8[1] = uVar5;
        puVar8 = (uint *)begin._M_current;
        if (puVar10 + -1 != (uint *)begin._M_current) {
          lVar7 = lVar14;
          do {
            uVar5 = *(uint *)((long)begin._M_current + lVar7 + -4);
            if (((uint)piVar2[(int)uVar5] <= (uint)piVar2[(int)uVar21]) &&
               (((uint)piVar2[(int)uVar5] < (uint)piVar2[(int)uVar21] ||
                (((ulong)uVar5 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 (ulong)uVar5 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20) <=
                 (uVar6 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32 ^
                 uVar6 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20))))) {
              puVar8 = (uint *)(lVar7 + (long)begin._M_current);
              break;
            }
            *(uint *)((long)begin._M_current + lVar7) = uVar5;
            lVar7 = lVar7 + -4;
          } while (lVar7 != 0);
        }
        *puVar8 = uVar21;
      }
      puVar20 = puVar10 + 1;
      lVar14 = lVar14 + 4;
      puVar8 = puVar10;
      puVar10 = puVar20;
    } while (puVar20 != (uint *)end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }